

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprModule * AnalyzeModule(ExpressionContext *ctx,SynModule *syntax)

{
  TypeBase *type_00;
  InplaceStr name;
  IntrusiveList<ExprBase> expressions_00;
  ByteCode *bytecode_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  Lexeme *lexStream_00;
  ExprBase *pEVar4;
  ExprModule *this;
  ExprBase **ppEVar5;
  FunctionData **ppFVar6;
  TypeBase **ppTVar7;
  SynBase *pSVar8;
  VariableData **ppVVar9;
  ExprVariableDefinition *this_00;
  VariableHandle *this_01;
  uint local_35c;
  undefined1 local_358 [4];
  uint i_5;
  TraceScope traceScope_4;
  TypeClass *pTStack_340;
  uint i_4;
  TypeClass *classType;
  TypeBase *type;
  char *pcStack_328;
  uint i_3;
  char *pos;
  TypeBase *parentType;
  FunctionData *function;
  undefined1 local_308 [4];
  uint i_2;
  SmallArray<TypeClass_*,_32U> classTypes;
  SmallArray<FunctionData_*,_32U> possibleFunctions;
  TraceScope traceScope_3;
  undefined1 local_c0 [4];
  uint i_1;
  TraceScope traceScope_2;
  undefined1 local_a8 [4];
  uint i;
  TraceScope traceScope_1;
  ExprModule *module;
  SynBase *expr;
  IntrusiveList<ExprBase> expressions;
  SynModuleImport *import;
  char *pcStack_58;
  Lexeme *local_50;
  Lexeme *lexStream;
  ByteCode *pBStack_40;
  uint lexStreamSize;
  char *bytecode;
  TraceScope traceScope;
  SynModule *syntax_local;
  ExpressionContext *ctx_local;
  
  if ((AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token), iVar1 != 0)
     ) {
    AnalyzeModule::token = NULLC::TraceGetToken("analyze","AnalyzeModule");
    __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)&bytecode,AnalyzeModule::token);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar2);
  pBStack_40 = (ByteCode *)BinaryCache::GetBytecode("$base$.nc");
  if (pBStack_40 != (ByteCode *)0x0) {
    lexStream._4_4_ = 0;
    lexStream_00 = BinaryCache::GetLexems("$base$.nc",(uint *)((long)&lexStream + 4));
    bytecode_00 = pBStack_40;
    uVar2 = lexStream._4_4_;
    local_50 = lexStream_00;
    if (pBStack_40 == (ByteCode *)0x0) {
      anon_unknown.dwarf_6f1cc::Stop
                (ctx,&syntax->super_SynBase,"ERROR: base module couldn\'t be imported");
    }
    else {
      InplaceStr::InplaceStr((InplaceStr *)&import,"$base$.nc");
      name.end = pcStack_58;
      name.begin = (char *)import;
      ImportModule(ctx,&syntax->super_SynBase,bytecode_00,lexStream_00,uVar2,name);
    }
    uVar2 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions);
    ctx->baseModuleFunctionCount = uVar2;
  }
  for (expressions.tail = (ExprBase *)(syntax->imports).head; expressions.tail != (ExprBase *)0x0;
      expressions.tail =
           (ExprBase *)getType<SynModuleImport>((SynBase *)expressions.tail[1]._vptr_ExprBase)) {
    AnalyzeModuleImport(ctx,(SynModuleImport *)expressions.tail);
  }
  AnalyzeImplicitModuleImports(ctx);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Import",uVar2);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar2);
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&expr);
  for (module = (ExprModule *)(syntax->expressions).head; module != (ExprModule *)0x0;
      module = (ExprModule *)module->moduleScope) {
    pEVar4 = AnalyzeStatement(ctx,(SynBase *)module);
    IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&expr,pEVar4);
  }
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Expressions",uVar2);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Start(&ctx->statistics,uVar2);
  ClosePendingUpvalues(ctx,(FunctionData *)0x0);
  if (ctx->errorCount == 0) {
    CreateDefaultArgumentFunctionWrappers(ctx);
  }
  this = ExpressionContext::get<ExprModule>(ctx);
  traceScope_1._8_8_ = expr;
  expressions_00.tail = expressions.head;
  expressions_00.head = (ExprBase *)expr;
  ExprModule::ExprModule
            (this,ctx->allocator,&syntax->super_SynBase,ctx->typeVoid,ctx->globalScope,
             expressions_00);
  if ((AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token), iVar1 != 0)
     ) {
    AnalyzeModule(ExpressionContext&,SynModule*)::token =
         NULLC::TraceGetToken("analyze","definitions");
    __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_a8,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  for (traceScope_2.lastLabelPos = 0; uVar2 = traceScope_2.lastLabelPos,
      uVar3 = SmallArray<ExprBase_*,_128U>::size(&ctx->definitions), uVar2 < uVar3;
      traceScope_2.lastLabelPos = traceScope_2.lastLabelPos + 1) {
    ppEVar5 = SmallArray<ExprBase_*,_128U>::operator[](&ctx->definitions,traceScope_2.lastLabelPos);
    SmallArray<ExprBase_*,_32U>::push_back(&this->definitions,ppEVar5);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_a8);
  if ((AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token), iVar1 != 0)
     ) {
    AnalyzeModule(ExpressionContext&,SynModule*)::token = NULLC::TraceGetToken("analyze","setup");
    __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_c0,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  for (traceScope_3.lastLabelPos = 0; uVar2 = SmallArray<ExprBase_*,_128U>::size(&ctx->setup),
      traceScope_3.lastLabelPos < uVar2; traceScope_3.lastLabelPos = traceScope_3.lastLabelPos + 1)
  {
    ppEVar5 = SmallArray<ExprBase_*,_128U>::operator[](&ctx->setup,traceScope_3.lastLabelPos);
    IntrusiveList<ExprBase>::push_back(&this->setup,*ppEVar5);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_c0);
  if ((AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token), iVar1 != 0)
     ) {
    AnalyzeModule(ExpressionContext&,SynModule*)::token = NULLC::TraceGetToken("analyze","vtables");
    __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)&possibleFunctions.allocator,
             AnalyzeModule(ExpressionContext&,SynModule*)::token);
  SmallArray<FunctionData_*,_32U>::SmallArray
            ((SmallArray<FunctionData_*,_32U> *)&classTypes.allocator,ctx->allocator);
  SmallArray<TypeClass_*,_32U>::SmallArray((SmallArray<TypeClass_*,_32U> *)local_308,ctx->allocator)
  ;
  for (function._4_4_ = 0; uVar2 = function._4_4_,
      uVar3 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions), uVar2 < uVar3;
      function._4_4_ = function._4_4_ + 1) {
    ppFVar6 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,function._4_4_);
    parentType = (TypeBase *)*ppFVar6;
    pos = (char *)((FunctionData *)parentType)->scope->ownerType;
    if ((((TypeBase *)pos != (TypeBase *)0x0) && ((((TypeBase *)pos)->isGeneric & 1U) == 0)) &&
       (pcStack_328 = strstr((((FunctionData *)parentType)->name->name).begin,"::"),
       pcStack_328 != (char *)0x0)) {
      SmallArray<FunctionData_*,_32U>::push_back
                ((SmallArray<FunctionData_*,_32U> *)&classTypes.allocator,
                 (FunctionData **)&parentType);
    }
  }
  for (type._4_4_ = 0; uVar2 = type._4_4_, uVar3 = SmallArray<TypeBase_*,_128U>::size(&ctx->types),
      uVar2 < uVar3; type._4_4_ = type._4_4_ + 1) {
    ppTVar7 = SmallArray<TypeBase_*,_128U>::operator[](&ctx->types,type._4_4_);
    classType = (TypeClass *)*ppTVar7;
    pTStack_340 = getType<TypeClass>((TypeBase *)classType);
    if (pTStack_340 != (TypeClass *)0x0) {
      SmallArray<TypeClass_*,_32U>::push_back
                ((SmallArray<TypeClass_*,_32U> *)local_308,&stack0xfffffffffffffcc0);
    }
  }
  for (traceScope_4.lastLabelPos = 0; uVar2 = traceScope_4.lastLabelPos,
      uVar3 = SmallArray<VariableData_*,_128U>::size(&ctx->vtables), uVar2 < uVar3;
      traceScope_4.lastLabelPos = traceScope_4.lastLabelPos + 1) {
    pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    ppVVar9 = SmallArray<VariableData_*,_128U>::operator[](&ctx->vtables,traceScope_4.lastLabelPos);
    pEVar4 = CreateVirtualTableUpdate
                       (ctx,pSVar8,*ppVVar9,(SmallArray<FunctionData_*,_32U> *)&classTypes.allocator
                        ,(SmallArray<TypeClass_*,_32U> *)local_308);
    IntrusiveList<ExprBase>::push_back(&this->setup,pEVar4);
  }
  SmallArray<TypeClass_*,_32U>::~SmallArray((SmallArray<TypeClass_*,_32U> *)local_308);
  SmallArray<FunctionData_*,_32U>::~SmallArray
            ((SmallArray<FunctionData_*,_32U> *)&classTypes.allocator);
  NULLC::TraceScope::~TraceScope((TraceScope *)&possibleFunctions.allocator);
  if ((AnalyzeModule(ExpressionContext&,SynModule*)::token == '\0') &&
     (iVar1 = __cxa_guard_acquire(&AnalyzeModule(ExpressionContext&,SynModule*)::token), iVar1 != 0)
     ) {
    AnalyzeModule(ExpressionContext&,SynModule*)::token = NULLC::TraceGetToken("analyze","upvalues")
    ;
    __cxa_guard_release(&AnalyzeModule(ExpressionContext&,SynModule*)::token);
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)local_358,AnalyzeModule(ExpressionContext&,SynModule*)::token);
  for (local_35c = 0; uVar2 = SmallArray<VariableData_*,_128U>::size(&ctx->upvalues),
      local_35c < uVar2; local_35c = local_35c + 1) {
    this_00 = ExpressionContext::get<ExprVariableDefinition>(ctx);
    pSVar8 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    type_00 = ctx->typeVoid;
    this_01 = ExpressionContext::get<VariableHandle>(ctx);
    ppVVar9 = SmallArray<VariableData_*,_128U>::operator[](&ctx->upvalues,local_35c);
    VariableHandle::VariableHandle(this_01,(SynBase *)0x0,*ppVVar9);
    ExprVariableDefinition::ExprVariableDefinition(this_00,pSVar8,type_00,this_01,(ExprBase *)0x0);
    IntrusiveList<ExprBase>::push_back(&this->setup,&this_00->super_ExprBase);
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_358);
  uVar2 = NULLCTime::clockMicro();
  CompilerStatistics::Finish(&ctx->statistics,"Finalization",uVar2);
  NULLC::TraceScope::~TraceScope((TraceScope *)&bytecode);
  return this;
}

Assistant:

ExprModule* AnalyzeModule(ExpressionContext &ctx, SynModule *syntax)
{
	TRACE_SCOPE("analyze", "AnalyzeModule");

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Import base module
	if(const char *bytecode = BinaryCache::GetBytecode("$base$.nc"))
	{
		unsigned lexStreamSize = 0;
		Lexeme *lexStream = BinaryCache::GetLexems("$base$.nc", lexStreamSize);

		if(bytecode)
			ImportModule(ctx, syntax, (ByteCode*)bytecode, lexStream, lexStreamSize, InplaceStr("$base$.nc"));
		else
			Stop(ctx, syntax, "ERROR: base module couldn't be imported");

		ctx.baseModuleFunctionCount = ctx.functions.size();
	}

	for(SynModuleImport *import = syntax->imports.head; import; import = getType<SynModuleImport>(import->next))
		AnalyzeModuleImport(ctx, import);

	AnalyzeImplicitModuleImports(ctx);

	ctx.statistics.Finish("Import", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expr = syntax->expressions.head; expr; expr = expr->next)
		expressions.push_back(AnalyzeStatement(ctx, expr));

	ctx.statistics.Finish("Expressions", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ClosePendingUpvalues(ctx, NULL);

	// Don't create wrappers in ill-formed module
	if(ctx.errorCount == 0)
		CreateDefaultArgumentFunctionWrappers(ctx);

	ExprModule *module = new (ctx.get<ExprModule>()) ExprModule(ctx.allocator, syntax, ctx.typeVoid, ctx.globalScope, expressions);

	{
		TRACE_SCOPE("analyze", "definitions");

		for(unsigned i = 0; i < ctx.definitions.size(); i++)
			module->definitions.push_back(ctx.definitions[i]);
	}

	{
		TRACE_SCOPE("analyze", "setup");

		for(unsigned i = 0; i < ctx.setup.size(); i++)
			module->setup.push_back(ctx.setup[i]);
	}

	{
		TRACE_SCOPE("analyze", "vtables");

		SmallArray<FunctionData*, 32> possibleFunctions(ctx.allocator);
		SmallArray<TypeClass*, 32> classTypes(ctx.allocator);

		for(unsigned i = 0; i < ctx.functions.size(); i++)
		{
			FunctionData *function = ctx.functions[i];

			TypeBase *parentType = function->scope->ownerType;

			if(!parentType)
				continue;

			if(parentType->isGeneric)
				continue;

			const char *pos = strstr(function->name->name.begin, "::");

			if(!pos)
				continue;

			possibleFunctions.push_back(function);
		}

		for(unsigned i = 0; i < ctx.types.size(); i++)
		{
			TypeBase *type = ctx.types[i];

			if(TypeClass *classType = getType<TypeClass>(type))
				classTypes.push_back(classType);
		}

		for(unsigned i = 0; i < ctx.vtables.size(); i++)
			module->setup.push_back(CreateVirtualTableUpdate(ctx, ctx.MakeInternal(syntax), ctx.vtables[i], possibleFunctions, classTypes));
	}

	{
		TRACE_SCOPE("analyze", "upvalues");

		for(unsigned i = 0; i < ctx.upvalues.size(); i++)
			module->setup.push_back(new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(ctx.MakeInternal(syntax), ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, ctx.upvalues[i]), NULL));
	}

	ctx.statistics.Finish("Finalization", NULLCTime::clockMicro());

	return module;
}